

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

void __thiscall fasttext::Dictionary::threshold(Dictionary *this,int64_t t,int64_t tl)

{
  anon_class_16_2_7fa2747b_for__M_pred __pred;
  const_iterator __first;
  string_view w;
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  pointer peVar4;
  reference pvVar5;
  Dictionary *this_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_RDI;
  int32_t h;
  iterator it;
  vector<fasttext::entry,_std::allocator<fasttext::entry>_> *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  vector<fasttext::entry,_std::allocator<fasttext::entry>_> *in_stack_ffffffffffffff48;
  const_iterator in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int32_t in_stack_ffffffffffffff5c;
  __normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
  in_stack_ffffffffffffff60;
  __normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
  in_stack_ffffffffffffff68;
  
  iVar2 = std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::begin
                    (in_stack_ffffffffffffff28);
  iVar3 = std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::end
                    (in_stack_ffffffffffffff28);
  std::
  sort<__gnu_cxx::__normal_iterator<fasttext::entry*,std::vector<fasttext::entry,std::allocator<fasttext::entry>>>,fasttext::Dictionary::threshold(long,long)::__0>
            (iVar2._M_current,iVar3._M_current);
  __last._M_current = in_RDI._M_current + 10;
  std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::begin(in_stack_ffffffffffffff28);
  std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::end(in_stack_ffffffffffffff28);
  __pred.tl._0_4_ = in_stack_ffffffffffffff58;
  __pred.t = (int64_t *)in_stack_ffffffffffffff50._M_current;
  __pred.tl._4_4_ = in_stack_ffffffffffffff5c;
  std::
  remove_if<__gnu_cxx::__normal_iterator<fasttext::entry*,std::vector<fasttext::entry,std::allocator<fasttext::entry>>>,fasttext::Dictionary::threshold(long,long)::__1>
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,__pred);
  __gnu_cxx::
  __normal_iterator<fasttext::entry_const*,std::vector<fasttext::entry,std::allocator<fasttext::entry>>>
  ::__normal_iterator<fasttext::entry*>
            ((__normal_iterator<const_fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
              *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             (__normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
              *)in_stack_ffffffffffffff28);
  std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::end(in_stack_ffffffffffffff28);
  __gnu_cxx::
  __normal_iterator<fasttext::entry_const*,std::vector<fasttext::entry,std::allocator<fasttext::entry>>>
  ::__normal_iterator<fasttext::entry*>
            ((__normal_iterator<const_fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
              *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             (__normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
              *)in_stack_ffffffffffffff28);
  __first._M_current._4_4_ = in_stack_ffffffffffffff5c;
  __first._M_current._0_4_ = in_stack_ffffffffffffff58;
  std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::erase
            (in_stack_ffffffffffffff48,__first,in_stack_ffffffffffffff50);
  std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::shrink_to_fit
            ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)0x1a89e8);
  in_RDI._M_current[0x16] = 0;
  in_RDI._M_current[0x17] = 0;
  in_RDI._M_current[0x18] = 0;
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff28);
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff28);
  std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (in_RDI,__last,(int *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::begin(in_stack_ffffffffffffff28);
  while( true ) {
    iVar2 = std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::end
                      (in_stack_ffffffffffffff28);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       (__normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
                        *)in_stack_ffffffffffffff28);
    if (!bVar1) break;
    peVar4 = __gnu_cxx::
             __normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
             ::operator->((__normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
                           *)&stack0xffffffffffffff68);
    std::__cxx11::string::operator_cast_to_basic_string_view((string *)peVar4);
    w._M_len._4_4_ = in_stack_ffffffffffffff5c;
    w._M_len._0_4_ = in_stack_ffffffffffffff58;
    w._M_str = (char *)iVar2._M_current;
    in_stack_ffffffffffffff5c = find(this_00,w);
    in_stack_ffffffffffffff34 = in_RDI._M_current[0x16];
    in_RDI._M_current[0x16] = in_stack_ffffffffffffff34 + 1;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI._M_current + 4),
                        (long)in_stack_ffffffffffffff5c);
    *pvVar5 = in_stack_ffffffffffffff34;
    peVar4 = __gnu_cxx::
             __normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
             ::operator->((__normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
                           *)&stack0xffffffffffffff68);
    if (peVar4->type == word) {
      in_RDI._M_current[0x17] = in_RDI._M_current[0x17] + 1;
    }
    peVar4 = __gnu_cxx::
             __normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
             ::operator->((__normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
                           *)&stack0xffffffffffffff68);
    if (peVar4->type == label) {
      in_RDI._M_current[0x18] = in_RDI._M_current[0x18] + 1;
    }
    __gnu_cxx::
    __normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
    ::operator++((__normal_iterator<fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
                  *)&stack0xffffffffffffff68);
  }
  return;
}

Assistant:

void Dictionary::threshold(int64_t t, int64_t tl) {
  sort(words_.begin(), words_.end(), [](const entry& e1, const entry& e2) {
    if (e1.type != e2.type) {
      return e1.type < e2.type;
    }
    return e1.count > e2.count;
  });
  words_.erase(
      remove_if(
          words_.begin(),
          words_.end(),
          [&](const entry& e) {
            return (e.type == entry_type::word && e.count < t) ||
                (e.type == entry_type::label && e.count < tl);
          }),
      words_.end());
  words_.shrink_to_fit();
  size_ = 0;
  nwords_ = 0;
  nlabels_ = 0;
  std::fill(word2int_.begin(), word2int_.end(), -1);
  for (auto it = words_.begin(); it != words_.end(); ++it) {
    int32_t h = find(it->word);
    word2int_[h] = size_++;
    if (it->type == entry_type::word) {
      nwords_++;
    }
    if (it->type == entry_type::label) {
      nlabels_++;
    }
  }
}